

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_runner.h
# Opt level: O3

void AssertEqual<std::__cxx11::string,char[11]>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t,char (*u) [11],
               string *hint)

{
  int iVar1;
  ostream *poVar2;
  size_t sVar3;
  runtime_error *this;
  ostringstream os;
  string local_1c0 [32];
  ostringstream local_1a0 [376];
  
  iVar1 = std::__cxx11::string::compare((char *)t);
  if (iVar1 == 0) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Assertion failed: ",0x12)
  ;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,(t->_M_dataplus)._M_p,t->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," != ",4);
  sVar3 = strlen(*u);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,*u,sVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," hint: ",7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,(hint->_M_dataplus)._M_p,hint->_M_string_length);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,local_1c0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void AssertEqual(const T& t, const U& u,
                 const string& hint)
{
    if (t != u) {
        ostringstream os;
        os << "Assertion failed: " << t << " != " << u
           << " hint: " << hint;
        throw runtime_error(os.str());
    }
}